

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O2

vector<bool,_std::allocator<bool>_> * __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
::get_content(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,
             List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
             *this,int columnLength)

{
  uint uVar1;
  ulong in_RAX;
  _List_node_base *p_Var2;
  reference rVar3;
  undefined8 uStack_28;
  
  if (columnLength < 0) {
    if ((this->column_).
        super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
        ._M_impl._M_node._M_size == 0) {
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      return __return_storage_ptr__;
    }
    columnLength = *(int *)((long)&((this->column_).
                                    super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
                                    ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next)->
                                   _M_next + 4) + 1;
  }
  uStack_28 = in_RAX & 0xffffffffffffff;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,(long)columnLength,(bool *)((long)&uStack_28 + 7),
             (allocator_type *)((long)&uStack_28 + 6));
  p_Var2 = (_List_node_base *)&this->column_;
  while ((p_Var2 = (((_List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
                      *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
         p_Var2 != (_List_node_base *)&this->column_ &&
         (uVar1 = *(uint *)((long)p_Var2[1]._M_next + 4), uVar1 < (uint)columnLength))) {
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (__return_storage_ptr__,(ulong)uVar1);
    *rVar3._M_p = *rVar3._M_p | rVar3._M_mask;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<typename List_column<Master_matrix>::Field_element> List_column<Master_matrix>::get_content(
    int columnLength) const
{
  if (columnLength < 0 && column_.size() > 0)
    columnLength = column_.back()->get_row_index() + 1;
  else if (columnLength < 0)
    return std::vector<Field_element>();

  std::vector<Field_element> container(columnLength, 0);
  for (auto it = column_.begin(); it != column_.end() && (*it)->get_row_index() < static_cast<ID_index>(columnLength);
       ++it) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      container[(*it)->get_row_index()] = 1;
    } else {
      container[(*it)->get_row_index()] = (*it)->get_element();
    }
  }
  return container;
}